

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoTetrahedra> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_01887160;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_01886db8,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_01886ab8;
  pzgeom::TPZNodeRep<4,_pztopology::TPZTetrahedron>::TPZNodeRep
            (&(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>,&PTR_PTR_0188dc40,
             nodeindices);
  (this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.super_TPZTetrahedron.super_TPZSavable
  ._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoTetrahedra_0188dbe8;
  lVar1 = 0x78;
  do {
    *(undefined ***)((long)(&this->fGeo + -2) + lVar1) = &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x50) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1e0);
  lVar1 = 0x78;
  do {
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x50) = 0xffffffffffffffff;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<4,_pztopology::TPZTetrahedron>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x1e0);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(nodeindices) {
	
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}